

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryStats.cpp
# Opt level: O1

void DictionaryStats::ClearStats(void)

{
  DictionaryStats *pDVar1;
  DictionaryType *pDVar2;
  DictionaryStats *buffer;
  DictionaryType *type;
  DictionaryType *buffer_00;
  
  buffer_00 = dictionaryTypes;
  if (dictionaryTypes != (DictionaryType *)0x0) {
    do {
      buffer = buffer_00->instances;
      while (buffer != (DictionaryStats *)0x0) {
        pDVar1 = buffer->pNext;
        Memory::NoCheckHeapAllocator::Free
                  ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,buffer,0x38);
        buffer = pDVar1;
      }
      pDVar2 = buffer_00->pNext;
      Memory::NoCheckHeapAllocator::Free
                ((NoCheckHeapAllocator *)&Memory::NoCheckHeapAllocator::Instance,buffer_00,0x118);
      buffer_00 = pDVar2;
    } while (pDVar2 != (DictionaryType *)0x0);
  }
  dictionaryTypes = (DictionaryType *)0x0;
  return;
}

Assistant:

void DictionaryStats::ClearStats()
{
    // Clear the collection since we already reported on what we already collected
    DictionaryType* current = dictionaryTypes;
    while(current)
    {
        DictionaryType *type = current;
        DictionaryStats *pNext = type->instances;
        while(pNext)
        {
            DictionaryStats *pCurrent = pNext;
            pNext = pNext->pNext;
            NoCheckHeapDelete(pCurrent);
        }
        current = current->pNext;
        NoCheckHeapDelete(type);
    }
    dictionaryTypes = NULL;
}